

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_list::apply_port_filter
          (peer_list *this,port_filter *filter,torrent_state *state,
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          *banned)

{
  pointer *ppbVar1;
  _Map_pointer ppptVar2;
  peer_connection_interface *ppVar3;
  _Map_pointer ppptVar4;
  _Elt_pointer pptVar5;
  _Elt_pointer pptVar6;
  iterator __position;
  _Map_pointer ppptVar7;
  _Map_pointer ppptVar8;
  _Elt_pointer pptVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  undefined4 extraout_var;
  _Map_pointer ppptVar16;
  _Elt_pointer pptVar17;
  torrent_state *extraout_RDX;
  ulong uVar18;
  torrent_state *ptVar19;
  ulong uVar20;
  _Elt_pointer pptVar21;
  _Elt_pointer local_98;
  int local_88;
  error_code local_60;
  iterator local_50;
  basic_endpoint<boost::asio::ip::tcp> *__args;
  
  pptVar21 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pptVar21 !=
      (this->m_peers).
      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      .
      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    ppptVar16 = (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_98 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
    pptVar17 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    ptVar19 = state;
    do {
      uVar14 = port_filter::access(filter,(char *)(ulong)(*pptVar21)->port,(int)ptVar19);
      if (((uVar14 & 1) == 0) || (*pptVar21 == this->m_locked_peer)) {
        pptVar21 = pptVar21 + 1;
        ptVar19 = extraout_RDX;
        if (pptVar21 == pptVar17) {
          pptVar21 = ppptVar16[1];
          ppptVar16 = ppptVar16 + 1;
          pptVar17 = pptVar21 + 0x40;
          local_98 = pptVar21;
        }
      }
      else {
        ppptVar2 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        iVar13 = (int)((long)(this->m_peers).
                             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             .
                             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)(this->m_peers).
                             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             .
                             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3);
        local_88 = (int)((long)pptVar21 - (long)local_98 >> 3) + iVar13 +
                   ((int)((ulong)((long)ppptVar16 - (long)ppptVar2) >> 3) + -1 +
                   (uint)(ppptVar16 == (_Map_pointer)0x0)) * 0x40;
        ppVar3 = (*pptVar21)->connection;
        if (ppVar3 != (peer_connection_interface *)0x0) {
          ppptVar4 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          pptVar5 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pptVar6 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
          iVar15 = (*ppVar3->_vptr_peer_connection_interface[2])();
          __args = (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var,iVar15);
          __position._M_current =
               (banned->
               super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (banned->
              super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)banned,__position,__args);
          }
          else {
            uVar10 = *(undefined8 *)&(__args->impl_).data_;
            uVar11 = *(undefined8 *)((long)&(__args->impl_).data_ + 8);
            uVar12 = *(undefined8 *)((long)&(__args->impl_).data_ + 0x14);
            *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 0xc) =
                 *(undefined8 *)((long)&(__args->impl_).data_ + 0xc);
            *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 0x14) = uVar12;
            *(undefined8 *)&((__position._M_current)->impl_).data_ = uVar10;
            *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 8) = uVar11;
            ppbVar1 = &(banned->
                       super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppbVar1 = *ppbVar1 + 1;
          }
          local_60 = errors::make_error_code(banned_by_port_filter);
          (*ppVar3->_vptr_peer_connection_interface[4])(ppVar3,&local_60,1,0);
          ppptVar7 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppptVar8 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          ptVar19 = (torrent_state *)
                    (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar9 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
          if ((int)((int)((ulong)((long)pptVar9 - (long)ptVar19) >> 3) +
                    (int)((ulong)((long)(this->m_peers).
                                        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                        .
                                        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(this->m_peers).
                                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                       .
                                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
                   ((((uint)((int)ppptVar7 - (int)ppptVar8) >> 3) - 1) +
                   (uint)(ppptVar7 == (_Map_pointer)0x0)) * 0x40) <
              (int)(iVar13 + (int)((ulong)((long)pptVar5 - (long)pptVar6) >> 3) +
                   ((((uint)((int)ppptVar4 - (int)ppptVar2) >> 3) - 1) +
                   (uint)(ppptVar4 == (_Map_pointer)0x0)) * 0x40)) {
            local_98 = (this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
            uVar20 = ((long)ptVar19 - (long)local_98 >> 3) + (long)local_88;
            if ((long)uVar20 < 0) {
              uVar18 = (long)uVar20 >> 6;
            }
            else {
              if (uVar20 < 0x40) {
                pptVar21 = (_Elt_pointer)
                           ((long)((ptVar19->ip).m_addresses + -1) + 0x30 + (long)local_88 * 8);
                ppptVar16 = ppptVar8;
                pptVar17 = pptVar9;
                goto LAB_0027fead;
              }
              uVar18 = uVar20 >> 6;
            }
            ppptVar16 = ppptVar8 + uVar18;
            local_98 = *ppptVar16;
            pptVar17 = local_98 + 0x40;
            ptVar19 = (torrent_state *)(uVar18 * 0x40);
            pptVar21 = local_98 + uVar20 + uVar18 * -0x40;
            goto LAB_0027fead;
          }
        }
        local_50._M_first = local_98;
        local_50._M_cur = pptVar21;
        local_50._M_last = pptVar17;
        local_50._M_node = ppptVar16;
        erase_peer(this,&local_50,state);
        pptVar21 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_98 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
        ppptVar16 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
        ptVar19 = (torrent_state *)(((long)pptVar21 - (long)local_98 >> 3) + (long)local_88);
        if ((long)ptVar19 < 0) {
          uVar20 = (long)ptVar19 >> 6;
        }
        else {
          if (ptVar19 < (torrent_state *)0x40) {
            pptVar17 = (this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last;
            pptVar21 = pptVar21 + local_88;
            goto LAB_0027fead;
          }
          uVar20 = (ulong)ptVar19 >> 6;
        }
        ppptVar16 = ppptVar16 + uVar20;
        local_98 = *ppptVar16;
        pptVar17 = local_98 + 0x40;
        ptVar19 = (torrent_state *)((long)ptVar19 + uVar20 * -0x40);
        pptVar21 = local_98 + (long)ptVar19;
      }
LAB_0027fead:
    } while (pptVar21 !=
             (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return;
}

Assistant:

void peer_list::apply_port_filter(port_filter const& filter
		, torrent_state* state, std::vector<tcp::endpoint>& banned)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		for (auto i = m_peers.begin(); i != m_peers.end();)
		{
			if ((filter.access((*i)->port) & port_filter::blocked) == 0)
			{
				++i;
				continue;
			}
			if (*i == m_locked_peer)
			{
				++i;
				continue;
			}

			int const current = int(i - m_peers.begin());
			TORRENT_ASSERT(current >= 0);
			TORRENT_ASSERT(m_peers.size() > 0);
			TORRENT_ASSERT(i != m_peers.end());

			if ((*i)->connection)
			{
				// disconnecting the peer here may also delete the
				// peer_info_struct. If that is the case, just continue
				int count = int(m_peers.size());
				peer_connection_interface* p = (*i)->connection;

				banned.push_back(p->remote());

				p->disconnect(errors::banned_by_port_filter, operation_t::bittorrent);
				// what *i refers to has changed, i.e. cur was deleted
				if (int(m_peers.size()) < count)
				{
					i = m_peers.begin() + current;
					continue;
				}
				TORRENT_ASSERT((*i)->connection == nullptr
					|| (*i)->connection->peer_info_struct() == nullptr);
			}

			erase_peer(i, state);
			i = m_peers.begin() + current;
		}
	}